

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall
fasttext::DenseMatrix::averageRowsToVector
          (DenseMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  uint *puVar4;
  undefined1 auVar5 [16];
  
  lVar2 = (this->super_Matrix).n_;
  if (lVar2 < 0x40) {
    if (lVar2 == 0x10) {
      averageRowsFast<16u>(x,rows,this);
      return;
    }
    if (lVar2 == 0x20) {
      averageRowsFast<32u>(x,rows,this);
      return;
    }
  }
  else {
    if (lVar2 == 0x40) {
      averageRowsFast<64u>(x,rows,this);
      return;
    }
    if (lVar2 == 0x100) {
      averageRowsFast<256u>(x,rows,this);
      return;
    }
    if (lVar2 == 0x200) {
      averageRowsFast<512u>(x,rows,this);
      return;
    }
  }
  Vector::zero(x);
  for (puVar4 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish, puVar4 != puVar1; puVar4 = puVar4 + 1) {
    (*(this->super_Matrix)._vptr_Matrix[4])(this,x,(ulong)*puVar4);
  }
  lVar2 = (long)puVar1 -
          (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar3 = lVar2 >> 2;
  auVar5._8_4_ = (int)(lVar2 >> 0x22);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  Vector::mul(x,(float)(1.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0))));
  return;
}

Assistant:

void DenseMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
#if defined(__AVX512F__) || defined(__AVX__) || defined(__SSE__)
  switch (cols()) {
    case 512:
      // Maximum number that can fit all in registers on AVX512F.
      averageRowsFast<512>(x, rows, *this);
      return;
    case 256:
      averageRowsFast<256>(x, rows, *this);
      return;
    case 64:
      averageRowsFast<64>(x, rows, *this);
      return;
    case 32:
      averageRowsFast<32>(x, rows, *this);
      return;
    case 16:
      averageRowsFast<16>(x, rows, *this);
      return;
  }
#endif
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}